

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O1

GdlGlyphClassDefn * __thiscall
GrcManager::ConvertClassToIntersection
          (GrcManager *this,Symbol psymClass,GdlGlyphClassDefn *pglfc,GrpLineAndFile *lnf)

{
  pointer pcVar1;
  GdlGlyphClassMember *pGVar2;
  int iVar3;
  long lVar4;
  GdlGlyphIntersectionClassDefn *this_00;
  Symbol this_01;
  string staName;
  string staAnonClassName;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if ((pglfc == (GdlGlyphClassDefn *)0x0) ||
     (lVar4 = __dynamic_cast(pglfc,&GdlGlyphClassDefn::typeinfo,
                             &GdlGlyphIntersectionClassDefn::typeinfo,0), lVar4 == 0)) {
    this_00 = (GdlGlyphIntersectionClassDefn *)operator_new(0x140);
    GdlGlyphClassDefn::GdlGlyphClassDefn((GdlGlyphClassDefn *)this_00);
    (this_00->super_GdlGlyphClassDefn).super_GdlGlyphClassMember.super_GdlDefn._vptr_GdlDefn =
         (_func_int **)&PTR__GdlGlyphIntersectionClassDefn_00241a20;
    (this_00->m_vpglfdSets).
    super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_vpglfdSets).
    super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_vpglfdSets).
    super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->m_vlnfSets).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_vlnfSets).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_vlnfSets).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = lnf->m_nLineOrig;
    pGVar2 = &(this_00->super_GdlGlyphClassDefn).super_GdlGlyphClassMember;
    (pGVar2->super_GdlDefn).super_GdlObject.m_lnf.m_nLinePre = lnf->m_nLinePre;
    (pGVar2->super_GdlDefn).super_GdlObject.m_lnf.m_nLineOrig = iVar3;
    std::__cxx11::string::_M_assign
              ((string *)
               &(this_00->super_GdlGlyphClassDefn).super_GdlGlyphClassMember.super_GdlDefn.
                super_GdlObject.m_lnf.m_staFile);
    local_b0 = local_a0;
    pcVar1 = (pglfc->m_staName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (pglfc->m_staName)._M_string_length);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,local_b0,local_a8 + (long)local_b0)
    ;
    std::__cxx11::string::_M_assign((string *)&(this_00->super_GdlGlyphClassDefn).m_staName);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    this_01 = GrcSymbolTable::AddAnonymousClassSymbol
                        (this->m_psymtbl,
                         &(pglfc->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject.m_lnf);
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_70,this_01);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    GrcSymbolTableEntry::ReplaceClassData(this_01,pglfc);
    GdlGlyphIntersectionClassDefn::AddSet(this_00,&pglfc->super_GdlGlyphClassMember,lnf);
    psymClass->m_pData = (GdlDefn *)this_00;
    psymClass->m_fHasData = true;
    GdlRenderer::AddGlyphClass(this->m_prndr,(GdlGlyphClassDefn *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pglfc = (GdlGlyphClassDefn *)this_00;
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  return &((GdlGlyphIntersectionClassDefn *)pglfc)->super_GdlGlyphClassDefn;
}

Assistant:

GdlGlyphClassDefn * GrcManager::ConvertClassToIntersection(Symbol psymClass,
	GdlGlyphClassDefn * pglfc, GrpLineAndFile & lnf)
{
	GdlGlyphClassDefn * pglfcRet;

	GdlGlyphIntersectionClassDefn * pglfci
			= dynamic_cast<GdlGlyphIntersectionClassDefn *>(pglfc);
	if (pglfci)
	{
		// Already an intersection class.
		pglfcRet = pglfc;
	}
	else
	{
		GdlGlyphIntersectionClassDefn * pglfciNew = new GdlGlyphIntersectionClassDefn();
		pglfciNew->SetLineAndFile(lnf);
		std::string staName = pglfc->Name();
		pglfciNew->SetName(staName);

		Symbol psymAnonClass = SymbolTable()->AddAnonymousClassSymbol(pglfc->LineAndFile());
		std::string staAnonClassName = psymAnonClass->FullName();
		pglfc->SetName(staAnonClassName);
		psymAnonClass->ReplaceClassData(pglfc);

		// Make the original class one of the set elements of the intersection.
		pglfciNew->AddSet(pglfc, lnf);
		psymClass->SetData(pglfciNew);

		pglfcRet = dynamic_cast<GdlGlyphClassDefn *>(pglfciNew);
		m_prndr->AddGlyphClass(pglfcRet);
	}

	return pglfcRet;
}